

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# makefile.cpp
# Opt level: O0

bool __thiscall
ReplaceExtraCompilerCacheKey::operator==
          (ReplaceExtraCompilerCacheKey *this,ReplaceExtraCompilerCacheKey *f)

{
  bool bVar1;
  QString *lhs;
  QString *pQVar2;
  ReplaceExtraCompilerCacheKey *in_RSI;
  QString *in_RDI;
  bool local_11;
  
  lhs = (QString *)hashCode(in_RSI);
  pQVar2 = (QString *)hashCode(in_RSI);
  local_11 = false;
  if ((lhs == pQVar2) && (local_11 = false, in_RSI->forShell == *(ReplaceFor *)&in_RDI[4].d.ptr)) {
    bVar1 = ::operator==(lhs,in_RDI);
    local_11 = false;
    if (bVar1) {
      bVar1 = ::operator==(lhs,in_RDI);
      local_11 = false;
      if (bVar1) {
        bVar1 = ::operator==(lhs,in_RDI);
        local_11 = false;
        if (bVar1) {
          local_11 = ::operator==(lhs,in_RDI);
        }
      }
    }
  }
  return local_11;
}

Assistant:

bool ReplaceExtraCompilerCacheKey::operator==(const ReplaceExtraCompilerCacheKey &f) const
{
    return (hashCode() == f.hashCode() &&
            f.forShell == forShell &&
            f.in == in &&
            f.out == out &&
            f.var == var &&
            f.pwd == pwd);
}